

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O1

vector<Patch::Change,_std::allocator<Patch::Change>_> * __thiscall
Patch::get_changes_in_range<Patch::OldCoordinates>
          (vector<Patch::Change,_std::allocator<Patch::Change>_> *__return_storage_ptr__,Patch *this
          ,Point start,Point end,bool inclusive)

{
  uint32_t uVar1;
  Text *pTVar2;
  Text *pTVar3;
  iterator __position;
  pointer pPVar4;
  bool bVar5;
  bool bVar6;
  uint32_t uVar7;
  Point PVar8;
  Point PVar9;
  pointer ppNVar10;
  Node *pNVar11;
  undefined7 in_register_00000081;
  uint32_t uVar12;
  uint32_t uVar13;
  size_type __new_size;
  initializer_list<Patch::PositionStackEntry> __l;
  vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_> left_ancestor_stack;
  Point node_end;
  Point node_new_start;
  Point node_old_start;
  Change change;
  Point node_start;
  Node *local_110;
  vector<Patch::Node_*,_std::allocator<Patch::Node_*>_> local_108;
  vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_> local_f0;
  Point local_d8;
  Point local_d0;
  uint32_t local_c8;
  undefined4 local_c4;
  vector<Patch::Change,std::allocator<Patch::Change>> *local_c0;
  Node *local_b8;
  uint32_t local_ac;
  PositionStackEntry local_a8;
  size_type local_90;
  Change local_88;
  Point local_48;
  Point local_40;
  Point local_38;
  
  local_c4 = (undefined4)CONCAT71(in_register_00000081,inclusive);
  (__return_storage_ptr__->super__Vector_base<Patch::Change,_std::allocator<Patch::Change>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Patch::Change,_std::allocator<Patch::Change>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Patch::Change,_std::allocator<Patch::Change>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_110 = this->root;
  local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Node **)0x0;
  local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (Node **)0x0;
  local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (Node **)0x0;
  local_c0 = (vector<Patch::Change,std::allocator<Patch::Change>> *)__return_storage_ptr__;
  local_40 = end;
  local_38 = start;
  Point::Point(&local_88.old_start);
  Point::Point(&local_88.old_end);
  local_88.new_start.row = 0;
  local_88.new_start.column = 0;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_88;
  std::vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>::vector
            (&local_f0,__l,(allocator_type *)&local_a8);
  __new_size = 0;
  local_90 = 0;
  local_b8 = (Node *)0x0;
  do {
    pPVar4 = local_f0.
             super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_110 == (Node *)0x0) break;
    local_a8.old_end =
         Point::traverse(&local_f0.
                          super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-1].old_end,
                         &local_110->old_distance_from_left_ancestor);
    local_d0 = Point::traverse(&pPVar4[-1].new_end,&local_110->new_distance_from_left_ancestor);
    PVar8 = Point::traverse(&local_a8.old_end,&local_110->old_extent);
    PVar9 = Point::traverse(&local_d0,&local_110->new_extent);
    local_d8 = PVar8;
    bVar5 = Point::operator>(&local_d8,&local_38);
    if ((bVar5) ||
       (((char)local_c4 != '\0' && (bVar5 = Point::operator==(&local_d8,&local_38), bVar5)))) {
      local_90 = (long)local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3;
      __new_size = ((long)local_f0.
                          super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_f0.
                          super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      local_b8 = local_110;
      if (local_110->left != (Node *)0x0) {
        if (local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Patch::Node*,std::allocator<Patch::Node*>>::
          _M_realloc_insert<Patch::Node*const&>
                    ((vector<Patch::Node*,std::allocator<Patch::Node*>> *)&local_108,
                     (iterator)
                     local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_110);
        }
        else {
          *local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
           super__Vector_impl_data._M_finish = local_110;
          local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        goto LAB_0016ea20;
      }
      bVar5 = false;
    }
    else {
      bVar5 = false;
      uVar13 = 0;
      if (local_110->right != (Node *)0x0) {
        if (local_110->left != (Node *)0x0) {
          uVar13 = local_110->left->old_subtree_text_size;
        }
        local_ac = pPVar4[-1].total_old_text_size;
        pTVar2 = (local_110->old_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>.
                 _M_t.super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
                 super__Head_base<0UL,_Text_*,_false>._M_head_impl;
        if (pTVar2 == (Text *)0x0) {
          local_c8 = local_110->old_text_size_;
        }
        else {
          local_c8 = Text::size(pTVar2);
        }
        uVar7 = 0;
        uVar12 = 0;
        if (local_110->left != (Node *)0x0) {
          uVar12 = local_110->left->new_subtree_text_size;
        }
        uVar1 = pPVar4[-1].total_new_text_size;
        pTVar2 = (local_110->new_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>.
                 _M_t.super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
                 super__Head_base<0UL,_Text_*,_false>._M_head_impl;
        if (pTVar2 != (Text *)0x0) {
          uVar7 = Text::size(pTVar2);
        }
        local_88.new_start.column = uVar12 + uVar1 + uVar7;
        local_88.new_start.row = uVar13 + local_ac + local_c8;
        local_88.old_start = PVar8;
        local_88.old_end = PVar9;
        if (local_f0.
            super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_f0.
            super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>::
          _M_realloc_insert<Patch::PositionStackEntry>
                    (&local_f0,
                     (iterator)
                     local_f0.
                     super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(PositionStackEntry *)&local_88);
        }
        else {
          (local_f0.
           super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish)->total_old_text_size = local_88.new_start.row
          ;
          (local_f0.
           super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish)->total_new_text_size =
               local_88.new_start.column;
          (local_f0.
           super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish)->old_end = PVar8;
          (local_f0.
           super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish)->new_end = PVar9;
          local_f0.
          super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_f0.
               super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        if (local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Patch::Node*,std::allocator<Patch::Node*>>::
          _M_realloc_insert<Patch::Node*const&>
                    ((vector<Patch::Node*,std::allocator<Patch::Node*>> *)&local_108,
                     (iterator)
                     local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_110);
        }
        else {
          *local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
           super__Vector_impl_data._M_finish = local_110;
          local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        local_110 = (Node *)&local_110->right;
LAB_0016ea20:
        local_110 = local_110->left;
        bVar5 = true;
      }
    }
  } while (bVar5);
  local_110 = local_b8;
  std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::resize(&local_108,local_90);
  std::vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>::resize
            (&local_f0,__new_size);
  do {
    pPVar4 = local_f0.
             super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_110 == (Node *)0x0) break;
    local_d0 = Point::traverse(&local_f0.
                                super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                                ._M_impl.super__Vector_impl_data._M_finish[-1].old_end,
                               &local_110->old_distance_from_left_ancestor);
    local_d8 = Point::traverse(&pPVar4[-1].new_end,&local_110->new_distance_from_left_ancestor);
    local_48 = local_d0;
    bVar6 = Point::operator>(&local_48,&local_40);
    bVar5 = true;
    if ((!bVar6) &&
       (((char)local_c4 != '\0' || (bVar6 = Point::operator==(&local_48,&local_40), !bVar6)))) {
      PVar8 = Point::traverse(&local_d0,&local_110->old_extent);
      PVar9 = Point::traverse(&local_d8,&local_110->new_extent);
      pTVar2 = (local_110->old_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>.
               _M_t.super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
               super__Head_base<0UL,_Text_*,_false>._M_head_impl;
      pTVar3 = (local_110->new_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>.
               _M_t.super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
               super__Head_base<0UL,_Text_*,_false>._M_head_impl;
      if (pTVar2 == (Text *)0x0) {
        local_88.old_text_size = local_110->old_text_size_;
      }
      else {
        local_88.old_text_size = Text::size(pTVar2);
      }
      pNVar11 = local_110->left;
      uVar12 = 0;
      uVar13 = 0;
      if (pNVar11 != (Node *)0x0) {
        uVar13 = pNVar11->old_subtree_text_size;
        uVar12 = pNVar11->new_subtree_text_size;
      }
      uVar13 = uVar13 + pPVar4[-1].total_old_text_size;
      uVar12 = uVar12 + pPVar4[-1].total_new_text_size;
      local_88.old_start = local_d0;
      local_88.new_start = local_d8;
      __position._M_current = *(Change **)(local_c0 + 8);
      local_88.old_end = PVar8;
      local_88.new_end = PVar9;
      local_88.old_text = pTVar2;
      local_88.new_text = pTVar3;
      local_88.preceding_old_text_size = uVar13;
      local_88.preceding_new_text_size = uVar12;
      if (__position._M_current == *(Change **)(local_c0 + 0x10)) {
        std::vector<Patch::Change,std::allocator<Patch::Change>>::
        _M_realloc_insert<Patch::Change_const&>(local_c0,__position,&local_88);
      }
      else {
        (__position._M_current)->preceding_old_text_size = uVar13;
        (__position._M_current)->preceding_new_text_size = uVar12;
        *(ulong *)&(__position._M_current)->old_text_size =
             CONCAT44(local_88._60_4_,local_88.old_text_size);
        (__position._M_current)->old_text = pTVar2;
        (__position._M_current)->new_text = pTVar3;
        (__position._M_current)->new_start = local_d8;
        (__position._M_current)->new_end = PVar9;
        (__position._M_current)->old_start = local_d0;
        (__position._M_current)->old_end = PVar8;
        *(Change **)(local_c0 + 8) = __position._M_current + 1;
      }
      if (local_110->right == (Node *)0x0) {
        bVar5 = local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
                super__Vector_impl_data._M_start ==
                local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
        ppNVar10 = local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        if (!bVar5) {
          pNVar11 = local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-1];
          if (pNVar11->right == local_110) {
            do {
              ppNVar10 = local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish + -1;
              local_f0.
              super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_f0.
                   super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1;
              bVar5 = ppNVar10 ==
                      local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
              if (bVar5) goto LAB_0016ec9a;
              bVar6 = local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-2]->right == pNVar11;
              pNVar11 = local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-2];
              local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish = ppNVar10;
            } while (bVar6);
          }
          ppNVar10 = local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          if (!bVar5) {
            local_110 = local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1];
            local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl
                 .super__Vector_impl_data._M_finish + -1;
            goto LAB_0016ed9a;
          }
        }
LAB_0016ec9a:
        local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppNVar10;
        local_110 = (Node *)0x0;
      }
      else {
        pTVar2 = (local_110->old_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>.
                 _M_t.super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
                 super__Head_base<0UL,_Text_*,_false>._M_head_impl;
        if (pTVar2 == (Text *)0x0) {
          uVar7 = local_110->old_text_size_;
        }
        else {
          uVar7 = Text::size(pTVar2);
        }
        pTVar2 = (local_110->new_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>.
                 _M_t.super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
                 super__Head_base<0UL,_Text_*,_false>._M_head_impl;
        if (pTVar2 == (Text *)0x0) {
          local_a8.total_new_text_size = 0;
        }
        else {
          local_a8.total_new_text_size = Text::size(pTVar2);
        }
        local_a8.total_old_text_size = uVar7 + uVar13;
        local_a8.total_new_text_size = local_a8.total_new_text_size + uVar12;
        local_a8.old_end = PVar8;
        local_a8.new_end = PVar9;
        if (local_f0.
            super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_f0.
            super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>::
          _M_realloc_insert<Patch::PositionStackEntry>
                    (&local_f0,
                     (iterator)
                     local_f0.
                     super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_a8);
        }
        else {
          (local_f0.
           super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish)->total_old_text_size =
               local_a8.total_old_text_size;
          (local_f0.
           super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish)->total_new_text_size =
               local_a8.total_new_text_size;
          (local_f0.
           super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish)->old_end = PVar8;
          (local_f0.
           super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish)->new_end = PVar9;
          local_f0.
          super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_f0.
               super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        if (local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Patch::Node*,std::allocator<Patch::Node*>>::
          _M_realloc_insert<Patch::Node*const&>
                    ((vector<Patch::Node*,std::allocator<Patch::Node*>> *)&local_108,
                     (iterator)
                     local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_110);
        }
        else {
          *local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
           super__Vector_impl_data._M_finish = local_110;
          local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        for (local_110 = local_110->right; local_110->left != (Node *)0x0;
            local_110 = local_110->left) {
          if (local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<Patch::Node*,std::allocator<Patch::Node*>>::
            _M_realloc_insert<Patch::Node*const&>
                      ((vector<Patch::Node*,std::allocator<Patch::Node*>> *)&local_108,
                       (iterator)
                       local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_110);
          }
          else {
            *local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
             super__Vector_impl_data._M_finish = local_110;
            local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
          }
        }
      }
LAB_0016ed9a:
      bVar5 = false;
    }
  } while (!bVar5);
  if (local_f0.
      super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.
                    super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f0.
                          super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.
                          super__Vector_base<Patch::PositionStackEntry,_std::allocator<Patch::PositionStackEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
      super__Vector_impl_data._M_start != (Node **)0x0) {
    operator_delete(local_108.super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_108.
                          super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.
                          super__Vector_base<Patch::Node_*,_std::allocator<Patch::Node_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (vector<Patch::Change,_std::allocator<Patch::Change>_> *)local_c0;
}

Assistant:

vector<Patch::Change> Patch::get_changes_in_range(Point start, Point end, bool inclusive) const {
  vector<Change> result;

  Node *node = root;
  vector<Node *> node_stack;
  vector<Patch::PositionStackEntry> left_ancestor_stack{{}};

  Node *found_node = nullptr;
  size_t found_node_ancestor_count = 0;
  size_t found_node_left_ancestor_count = 0;

  while (node) {
    auto &left_ancestor_info = left_ancestor_stack.back();
    Point node_old_start = left_ancestor_info.old_end.traverse(node->old_distance_from_left_ancestor);
    Point node_new_start = left_ancestor_info.new_end.traverse(node->new_distance_from_left_ancestor);
    Point node_old_end = node_old_start.traverse(node->old_extent);
    Point node_new_end = node_new_start.traverse(node->new_extent);

    Point node_end = CoordinateSpace::choose(node_old_end, node_new_end);
    if (node_end > start || (inclusive && node_end == start)) {
      found_node_ancestor_count = node_stack.size();
      found_node_left_ancestor_count = left_ancestor_stack.size();
      found_node = node;
      if (node->left) {
        node_stack.push_back(node);
        node = node->left;
      } else {
        break;
      }
    } else {
      if (node->right) {
        left_ancestor_stack.push_back({
          node_old_end,
          node_new_end,
          left_ancestor_info.total_old_text_size + node->left_subtree_old_text_size() + node->old_text_size(),
          left_ancestor_info.total_new_text_size + node->left_subtree_new_text_size() + node->new_text_size()
        });
        node_stack.push_back(node);
        node = node->right;
      } else {
        break;
      }
    }
  }

  node = found_node;
  node_stack.resize(found_node_ancestor_count);
  left_ancestor_stack.resize(found_node_left_ancestor_count);

  while (node) {
    PositionStackEntry &left_ancestor_info = left_ancestor_stack.back();
    Point old_start = left_ancestor_info.old_end.traverse(
        node->old_distance_from_left_ancestor);
    Point new_start = left_ancestor_info.new_end.traverse(
        node->new_distance_from_left_ancestor);
    Point node_start = CoordinateSpace::choose(old_start, new_start);
    if (node_start > end || (!inclusive && node_start == end)) break;

    Point old_end = old_start.traverse(node->old_extent);
    Point new_end = new_start.traverse(node->new_extent);
    Text *old_text = node->old_text.get();
    Text *new_text = node->new_text.get();
    uint32_t old_text_size = node->old_text_size();
    uint32_t preceding_old_text_size =
      left_ancestor_info.total_old_text_size + node->left_subtree_old_text_size();
    uint32_t preceding_new_text_size =
      left_ancestor_info.total_new_text_size + node->left_subtree_new_text_size();
    Change change{
      old_start,
      old_end,
      new_start,
      new_end,
      old_text,
      new_text,
      preceding_old_text_size,
      preceding_new_text_size,
      old_text_size,
    };
    result.push_back(change);

    if (node->right) {
      left_ancestor_stack.push_back(PositionStackEntry{
        old_end,
        new_end,
        preceding_old_text_size + node->old_text_size(),
        preceding_new_text_size + node->new_text_size()
      });
      node_stack.push_back(node);
      node = node->right;

      while (node->left) {
        node_stack.push_back(node);
        node = node->left;
      }
    } else {
      while (!node_stack.empty() && node_stack.back()->right == node) {
        node = node_stack.back();
        node_stack.pop_back();
        left_ancestor_stack.pop_back();
      }

      if (node_stack.empty()) {
        node = nullptr;
      } else {
        node = node_stack.back();
        node_stack.pop_back();
      }
    }
  }

  return result;
}